

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_7246::assert_key_eq(art_key_chunk_t *key1,art_key_chunk_t *key2)

{
  art_key_chunk_t *in_RSI;
  long in_RDI;
  size_t i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < 6; uVar1 = uVar1 + 1) {
    if (*(art_key_chunk_t *)(in_RDI + uVar1) != in_RSI[uVar1]) {
      print_key(in_RSI);
      printf(" != ");
      print_key(in_RSI);
      printf("\n");
      _fail((char *)in_RSI,(int)(uVar1 >> 0x20));
    }
  }
  return;
}

Assistant:

void assert_key_eq(const art_key_chunk_t* key1, const art_key_chunk_t* key2) {
    for (size_t i = 0; i < ART_KEY_BYTES; ++i) {
        if (*(key1 + i) != *(key2 + i)) {
            print_key(key1);
            printf(" != ");
            print_key(key2);
            printf("\n");

            fail();
        }
    }
}